

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# provider_core.c
# Opt level: O0

void ossl_provider_deregister_child_cb(OSSL_CORE_HANDLE *handle)

{
  int iVar1;
  provider_store_st *ppVar2;
  OSSL_PROVIDER *in_RDI;
  OSSL_PROVIDER_CHILD_CB *child_cb;
  int max;
  int i;
  provider_store_st *store;
  OSSL_LIB_CTX *libctx;
  OSSL_PROVIDER *thisprov;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  OSSL_LIB_CTX *in_stack_ffffffffffffffd0;
  int local_24;
  
  ppVar2 = get_provider_store(in_stack_ffffffffffffffd0);
  if ((ppVar2 != (provider_store_st *)0x0) &&
     (iVar1 = CRYPTO_THREAD_write_lock
                        ((CRYPTO_RWLOCK *)
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)), iVar1 != 0)
     ) {
    iVar1 = sk_OSSL_PROVIDER_CHILD_CB_num((stack_st_OSSL_PROVIDER_CHILD_CB *)0x294fca);
    for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
      in_stack_ffffffffffffffd0 =
           (OSSL_LIB_CTX *)
           sk_OSSL_PROVIDER_CHILD_CB_value
                     ((stack_st_OSSL_PROVIDER_CHILD_CB *)in_stack_ffffffffffffffd0,
                      in_stack_ffffffffffffffcc);
      if ((OSSL_PROVIDER *)in_stack_ffffffffffffffd0->lock == in_RDI) {
        sk_OSSL_PROVIDER_CHILD_CB_delete
                  ((stack_st_OSSL_PROVIDER_CHILD_CB *)in_stack_ffffffffffffffd0,
                   in_stack_ffffffffffffffcc);
        CRYPTO_free(in_stack_ffffffffffffffd0);
        break;
      }
    }
    CRYPTO_THREAD_unlock
              ((CRYPTO_RWLOCK *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  return;
}

Assistant:

static void ossl_provider_deregister_child_cb(const OSSL_CORE_HANDLE *handle)
{
    /*
     * This is really an OSSL_PROVIDER that we created and cast to
     * OSSL_CORE_HANDLE originally. Therefore it is safe to cast it back.
     */
    OSSL_PROVIDER *thisprov = (OSSL_PROVIDER *)handle;
    OSSL_LIB_CTX *libctx = thisprov->libctx;
    struct provider_store_st *store = NULL;
    int i, max;
    OSSL_PROVIDER_CHILD_CB *child_cb;

    if ((store = get_provider_store(libctx)) == NULL)
        return;

    if (!CRYPTO_THREAD_write_lock(store->lock))
        return;
    max = sk_OSSL_PROVIDER_CHILD_CB_num(store->child_cbs);
    for (i = 0; i < max; i++) {
        child_cb = sk_OSSL_PROVIDER_CHILD_CB_value(store->child_cbs, i);
        if (child_cb->prov == thisprov) {
            /* Found an entry */
            sk_OSSL_PROVIDER_CHILD_CB_delete(store->child_cbs, i);
            OPENSSL_free(child_cb);
            break;
        }
    }
    CRYPTO_THREAD_unlock(store->lock);
}